

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

SMBusByte * __thiscall
SMBusByte::ToDataWord(SMBusByte *this,SMBusByte *sec,SMBusFrameType frame_type)

{
  pointer pSVar1;
  undefined1 uVar2;
  undefined6 uVar3;
  U8 in_CL;
  undefined4 in_register_00000014;
  
  Frame::Frame((Frame *)this);
  this[1].value = in_CL;
  pSVar1 = (sec->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(undefined1 *)((long)&pSVar1->sample_begin + 1);
  uVar3 = *(undefined6 *)((long)&pSVar1->sample_begin + 2);
  this->value = *(undefined1 *)&pSVar1->sample_begin;
  this->is_acked = (bool)uVar2;
  *(undefined6 *)&this->field_0x2 = uVar3;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start =
       *(pointer *)
        (*(long *)((undefined1 *)CONCAT44(in_register_00000014,frame_type) + 0x10) + -0x20);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(ulong)CONCAT11(sec->value,*(undefined1 *)CONCAT44(in_register_00000014,frame_type))
  ;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = sec->is_acked;
  return this;
}

Assistant:

Frame SMBusByte::ToDataWord( const SMBusByte& sec, SMBusFrameType frame_type ) const
{
    Frame f;

    f.mType = frame_type;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = sec.signals.back().sample_end;
    f.mData1 = value;
    f.mData1 <<= 8;
    f.mData1 |= sec.value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}